

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
BamTools::BamAlignment::GetTagNames_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,BamAlignment *this)

{
  char *pcVar1;
  char storageType;
  size_type sVar2;
  char *pcVar3;
  bool bVar4;
  uint uVar5;
  char *pTagData;
  uint local_5c;
  char *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (((this->SupportData).HasCoreOnly == false) &&
     (sVar2 = (this->TagData)._M_string_length, sVar2 != 0)) {
    local_58 = (this->TagData)._M_dataplus._M_p;
    uVar5 = (uint)sVar2;
    if (uVar5 != 0) {
      local_5c = 0;
      while( true ) {
        pcVar3 = local_58;
        pcVar1 = local_58 + 2;
        local_58 = local_58 + 3;
        local_5c = local_5c + 3;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar3,pcVar1);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        storageType = *pcVar1;
        if (storageType == '\0') break;
        bVar4 = SkipToNextTag(this,storageType,&local_58,&local_5c);
        if (!bVar4) {
          return __return_storage_ptr__;
        }
        if (*local_58 == '\0') {
          return __return_storage_ptr__;
        }
        if (uVar5 <= local_5c) {
          return __return_storage_ptr__;
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> BamAlignment::GetTagNames() const
{

    std::vector<std::string> result;
    if (SupportData.HasCoreOnly || TagData.empty()) {
        return result;
    }

    char* pTagData = (char*)TagData.data();
    const unsigned int tagDataLength = TagData.size();
    unsigned int numBytesParsed = 0;
    while (numBytesParsed < tagDataLength) {

        // get current tag name & type
        const char* pTagName = pTagData;
        const char* pTagType = pTagData + 2;
        pTagData += 3;
        numBytesParsed += 3;

        // store tag name
        result.push_back(std::string(pTagName, 2));

        // find the next tag
        if (*pTagType == '\0') {
            break;
        }
        if (!SkipToNextTag(*pTagType, pTagData, numBytesParsed)) {
            break;
        }
        if (*pTagData == '\0') {
            break;
        }
    }

    return result;
}